

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UVector::indexOf(UVector *this,UElement key,int32_t startIndex,int8_t hint)

{
  UBool UVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->comparer == (UElementsAreEqual *)0x0) {
    for (uVar3 = (ulong)startIndex; (long)uVar3 < (long)this->count; uVar3 = uVar3 + 1) {
      if ((hint & 1U) == 0) {
        if (this->elements[uVar3].integer == key.integer) goto LAB_002c532e;
      }
      else if (this->elements[uVar3].pointer == key.pointer) goto LAB_002c532e;
    }
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    for (uVar2 = (ulong)startIndex; (long)uVar2 < (long)this->count; uVar2 = uVar2 + 1) {
      UVar1 = (*this->comparer)((UElement)key.pointer,(UElement)this->elements[uVar2].pointer);
      if (UVar1 != '\0') {
        uVar3 = uVar2 & 0xffffffff;
        break;
      }
    }
  }
LAB_002c532e:
  return (int32_t)uVar3;
}

Assistant:

int32_t UVector::indexOf(UElement key, int32_t startIndex, int8_t hint) const {
    int32_t i;
    if (comparer != 0) {
        for (i=startIndex; i<count; ++i) {
            if ((*comparer)(key, elements[i])) {
                return i;
            }
        }
    } else {
        for (i=startIndex; i<count; ++i) {
            /* Pointers are not always the same size as ints so to perform
             * a valid comparision we need to know whether we are being
             * provided an int or a pointer. */
            if (hint & HINT_KEY_POINTER) {
                if (key.pointer == elements[i].pointer) {
                    return i;
                }
            } else {
                if (key.integer == elements[i].integer) {
                    return i;
                }
            }
        }
    }
    return -1;
}